

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O3

TermList __thiscall Parse::TPTP::createTypeConApplication(TPTP *this,string *name,uint arity)

{
  TermList *pTVar1;
  pointer pcVar2;
  TermList msg_1;
  TermList TVar3;
  Exception *pEVar4;
  AtomicSort *pAVar5;
  long lVar6;
  long lVar7;
  TermList t;
  bool added;
  bool local_55;
  uint local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_55 = false;
  local_54 = Kernel::Signature::addTypeCon(DAT_00b521b0,name,arity,&local_55);
  if (local_55 == true) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x50);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
    Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*,unsigned_int>
              (pEVar4,"Undeclared type constructor ",&local_50,"/",arity);
    pEVar4->_vptr_Exception = (_func_int **)&PTR_cry_00b3e0a8;
    *(undefined4 *)&pEVar4[1]._vptr_Exception = 0;
    pEVar4[1]._message._M_dataplus._M_p = (pointer)&pEVar4[1]._message.field_2;
    pEVar4[1]._message._M_string_length = 0;
    pEVar4[1]._message.field_2._M_local_buf[0] = '\0';
    __cxa_throw(pEVar4,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  if (arity == 0) {
    pAVar5 = Kernel::AtomicSort::create(local_54,0,(TermList *)0x0);
    return (TermList)(uint64_t)pAVar5;
  }
  pTVar1 = (this->_termLists)._stack;
  lVar6 = ((ulong)((long)(this->_termLists)._cursor - (long)pTVar1) >> 3) - (ulong)arity;
  t._content = pTVar1[lVar6]._content;
  msg_1 = sortOf(this,t);
  TVar3 = Kernel::AtomicSort::superSort();
  if (msg_1._content == TVar3._content) {
    lVar7 = 1;
    do {
      if (arity <= (uint)lVar7) {
        pAVar5 = Kernel::AtomicSort::create(local_54,arity,pTVar1 + lVar6);
        (this->_termLists)._cursor = (this->_termLists)._cursor + (-1 - (ulong)(arity - 1));
        return (TermList)(uint64_t)pAVar5;
      }
      t._content = (pTVar1 + lVar6)[lVar7]._content;
      lVar7 = lVar7 + 1;
      msg_1 = sortOf(this,t);
      TVar3 = Kernel::AtomicSort::superSort();
    } while (msg_1._content == TVar3._content);
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(0x50);
  Lib::Exception::Exception<char_const*,Kernel::TermList,char_const*,Kernel::TermList,char_const*>
            (pEVar4,"The sort ",msg_1," of type argument ",t," is not $tType as mandated by TF1");
  pEVar4->_vptr_Exception = (_func_int **)&PTR_cry_00b3e0a8;
  *(undefined4 *)&pEVar4[1]._vptr_Exception = 0;
  pEVar4[1]._message._M_dataplus._M_p = (pointer)&pEVar4[1]._message.field_2;
  pEVar4[1]._message._M_string_length = 0;
  pEVar4[1]._message.field_2._M_local_buf[0] = '\0';
  __cxa_throw(pEVar4,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

TermList TPTP::createTypeConApplication(std::string name, unsigned arity)
{ 
  ASS_GE(_termLists.size(), arity);

  bool added = false;
  unsigned typeCon = env.signature->addTypeCon(name,arity,added);
  if(added)
    USER_ERROR("Undeclared type constructor ", name, "/", arity);

  auto args = nLastTermLists(arity);
  for (auto i : range(0, arity)) {
    auto term = args[i];
    auto sort = sortOf(term);
    if (sort != AtomicSort::superSort()) 
        USER_ERROR("The sort ", sort, " of type argument ", term, " is not $tType as mandated by TF1");
  }
  auto s = TermList(AtomicSort::create(typeCon, arity, args));
  _termLists.pop(arity);
  return s;
}